

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.hpp
# Opt level: O3

void __thiscall Jzon::Node::setNull(Node *this)

{
  Data *pDVar1;
  
  if ((this->data != (Data *)0x0) && (this->data->type - T_NULL < 4)) {
    detach(this);
    pDVar1 = this->data;
    pDVar1->type = T_NULL;
    (pDVar1->valueStr)._M_string_length = 0;
    *(pDVar1->valueStr)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

inline bool isObject() const { return (getType() == T_OBJECT);  }